

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool __thiscall
r_comp::Compiler::read_reference
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write,
          ReturnType t)

{
  ushort uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ImageObject *pIVar3;
  pointer psVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  Atom *pAVar9;
  ulong uVar10;
  undefined6 in_register_00000012;
  ushort uVar11;
  undefined7 in_register_00000081;
  ushort uVar12;
  ushort *puVar13;
  uint32_t cast_opcode;
  uint16_t index;
  vector<short,_std::allocator<short>_> v;
  Atom aAStack_b8 [4];
  Atom local_b4 [6];
  ushort local_ae;
  undefined4 local_ac;
  vector<short,_std::allocator<short>_> local_a8;
  uint local_84;
  Ptr local_80;
  Ptr local_70;
  Ptr local_60;
  Ptr local_50;
  Ptr local_40;
  
  local_ac = (undefined4)CONCAT71(in_register_00000081,write);
  if (((t == ANY) || ((this->current_class).type == t)) &&
     (iVar7 = std::__cxx11::string::compare
                        ((char *)&((node->
                                   super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->cmd), iVar7 == 0)) {
    if ((char)local_ac == '\0') {
      return true;
    }
    r_code::Atom::This();
    pAVar9 = r_code::vector<r_code::Atom>::operator[]
                       ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(pAVar9,(Atom *)&local_a8);
  }
  else {
    peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_84 = (uint)CONCAT62(in_register_00000012,write_index);
    iVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->local_references)._M_h,&peVar2->cmd);
    if ((iVar8.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
         ._M_cur == (__node_type *)0x0) ||
       ((t != ANY &&
        (*(ReturnType *)
          ((long)iVar8.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                 ._M_cur + 0x70) != t)))) {
      bVar6 = false;
    }
    else {
      local_ae = *(ushort *)
                  ((long)iVar8.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                         ._M_cur + 0x28);
      bVar6 = true;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    uVar5 = local_84;
    if (bVar6) {
      if ((char)local_ac == '\0') {
        return true;
      }
      r_code::Atom::VLPointer((ushort)&local_a8,local_ae);
      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(ushort)local_84
                         );
      r_code::Atom::operator=(pAVar9,(Atom *)&local_a8);
    }
    else {
      local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
      if (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar6 = global_reference(this,&local_50,&local_ae,t);
      if (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (!bVar6) {
        local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar6 = this_indirection(this,&local_60,&local_a8,t);
        if (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar6) {
          bVar6 = true;
          if ((char)local_ac != '\0') {
            r_code::Atom::IPointer((ushort)local_b4);
            pAVar9 = r_code::vector<r_code::Atom>::operator[]
                               ((vector<r_code::Atom> *)(this->current_object + 8),
                                (ulong)(uVar5 & 0xffff));
            r_code::Atom::operator=(pAVar9,local_b4);
            r_code::Atom::~Atom(local_b4);
            r_code::Atom::CPointer((uchar)local_b4);
            pIVar3 = this->current_object;
            uVar11 = *extent_index;
            *extent_index = uVar11 + 1;
            pAVar9 = r_code::vector<r_code::Atom>::operator[]
                               ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
            r_code::Atom::operator=(pAVar9,local_b4);
            r_code::Atom::~Atom(local_b4);
            r_code::Atom::This();
            pIVar3 = this->current_object;
            uVar11 = *extent_index;
            *extent_index = uVar11 + 1;
            pAVar9 = r_code::vector<r_code::Atom>::operator[]
                               ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
            r_code::Atom::operator=(pAVar9,local_b4);
            r_code::Atom::~Atom(local_b4);
            psVar4 = local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              puVar13 = (ushort *)
                        local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                uVar11 = *puVar13;
                if (uVar11 == 0xfffd) {
                  r_code::Atom::Vws();
                  pIVar3 = this->current_object;
                  uVar11 = *extent_index;
                  *extent_index = uVar11 + 1;
                  pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
                  r_code::Atom::operator=(pAVar9,local_b4);
                }
                else if (uVar11 == 0xfffe) {
                  r_code::Atom::Mks();
                  pIVar3 = this->current_object;
                  uVar11 = *extent_index;
                  *extent_index = uVar11 + 1;
                  pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
                  r_code::Atom::operator=(pAVar9,local_b4);
                }
                else if (uVar11 == 0xffff) {
                  r_code::Atom::View();
                  pIVar3 = this->current_object;
                  uVar11 = *extent_index;
                  *extent_index = uVar11 + 1;
                  pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
                  r_code::Atom::operator=(pAVar9,local_b4);
                }
                else {
                  r_code::Atom::IPointer((ushort)local_b4);
                  pIVar3 = this->current_object;
                  uVar11 = *extent_index;
                  *extent_index = uVar11 + 1;
                  pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
                  r_code::Atom::operator=(pAVar9,local_b4);
                }
                r_code::Atom::~Atom(local_b4);
                puVar13 = puVar13 + 1;
              } while (puVar13 != (ushort *)psVar4);
            }
          }
        }
        else {
          local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar6 = local_indirection(this,&local_70,&local_a8,t,(uint32_t *)local_b4);
          if (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          uVar11 = (ushort)aAStack_b8;
          if (bVar6) {
            bVar6 = true;
            if ((char)local_ac != '\0') {
              r_code::Atom::IPointer(uVar11);
              pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(this->current_object + 8),
                                  (ulong)(uVar5 & 0xffff));
              r_code::Atom::operator=(pAVar9,aAStack_b8);
              r_code::Atom::~Atom(aAStack_b8);
              r_code::Atom::CPointer((uchar)aAStack_b8);
              pIVar3 = this->current_object;
              uVar12 = *extent_index;
              *extent_index = uVar12 + 1;
              pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar12);
              r_code::Atom::operator=(pAVar9,aAStack_b8);
              r_code::Atom::~Atom(aAStack_b8);
              r_code::Atom::VLPointer
                        (uVar11,*local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                 super__Vector_impl_data._M_start);
              pIVar3 = this->current_object;
              uVar12 = *extent_index;
              *extent_index = uVar12 + 1;
              pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar12);
              r_code::Atom::operator=(pAVar9,aAStack_b8);
              r_code::Atom::~Atom(aAStack_b8);
              if (2 < (ulong)((long)local_a8.super__Vector_base<short,_std::allocator<short>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.super__Vector_base<short,_std::allocator<short>_>.
                                   _M_impl.super__Vector_impl_data._M_start)) {
                uVar10 = 1;
                uVar12 = 2;
                do {
                  uVar1 = local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10];
                  if (uVar1 == 0xfffd) {
                    r_code::Atom::Vws();
                    pIVar3 = this->current_object;
                    uVar1 = *extent_index;
                    *extent_index = uVar1 + 1;
                    pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                       ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar9,aAStack_b8);
                  }
                  else if (uVar1 == 0xfffe) {
                    r_code::Atom::Mks();
                    pIVar3 = this->current_object;
                    uVar1 = *extent_index;
                    *extent_index = uVar1 + 1;
                    pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                       ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar9,aAStack_b8);
                  }
                  else if (uVar1 == 0xffff) {
                    r_code::Atom::View();
                    pIVar3 = this->current_object;
                    uVar1 = *extent_index;
                    *extent_index = uVar1 + 1;
                    pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                       ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar9,aAStack_b8);
                  }
                  else {
                    r_code::Atom::IPointer(uVar11);
                    pIVar3 = this->current_object;
                    uVar1 = *extent_index;
                    *extent_index = uVar1 + 1;
                    pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                       ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar9,aAStack_b8);
                  }
                  r_code::Atom::~Atom(aAStack_b8);
                  uVar10 = (ulong)uVar12;
                  uVar12 = uVar12 + 1;
                } while (uVar10 < (ulong)((long)local_a8.
                                                super__Vector_base<short,_std::allocator<short>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_a8.
                                                super__Vector_base<short,_std::allocator<short>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 1));
              }
            }
          }
          else {
            local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            bVar6 = global_indirection(this,&local_80,&local_a8,t);
            if (local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (bVar6) {
              bVar6 = true;
              if ((char)local_ac != '\0') {
                r_code::Atom::IPointer(uVar11);
                pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(this->current_object + 8),
                                    (ulong)(uVar5 & 0xffff));
                r_code::Atom::operator=(pAVar9,aAStack_b8);
                r_code::Atom::~Atom(aAStack_b8);
                r_code::Atom::CPointer((uchar)aAStack_b8);
                pIVar3 = this->current_object;
                uVar12 = *extent_index;
                *extent_index = uVar12 + 1;
                pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar12);
                r_code::Atom::operator=(pAVar9,aAStack_b8);
                r_code::Atom::~Atom(aAStack_b8);
                r_code::Atom::RPointer(uVar11);
                pIVar3 = this->current_object;
                uVar12 = *extent_index;
                *extent_index = uVar12 + 1;
                pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar12);
                r_code::Atom::operator=(pAVar9,aAStack_b8);
                r_code::Atom::~Atom(aAStack_b8);
                if (2 < (ulong)((long)local_a8.super__Vector_base<short,_std::allocator<short>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_a8.super__Vector_base<short,_std::allocator<short>_>.
                                     _M_impl.super__Vector_impl_data._M_start)) {
                  uVar10 = 1;
                  uVar12 = 2;
                  do {
                    if (local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10] == 0xfffd) {
                      r_code::Atom::Vws();
                      pIVar3 = this->current_object;
                      uVar1 = *extent_index;
                      *extent_index = uVar1 + 1;
                      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                         ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                      r_code::Atom::operator=(pAVar9,aAStack_b8);
                    }
                    else if (local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10] == 0xfffe) {
                      r_code::Atom::Mks();
                      pIVar3 = this->current_object;
                      uVar1 = *extent_index;
                      *extent_index = uVar1 + 1;
                      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                         ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                      r_code::Atom::operator=(pAVar9,aAStack_b8);
                    }
                    else {
                      r_code::Atom::IPointer(uVar11);
                      pIVar3 = this->current_object;
                      uVar1 = *extent_index;
                      *extent_index = uVar1 + 1;
                      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                         ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                      r_code::Atom::operator=(pAVar9,aAStack_b8);
                    }
                    r_code::Atom::~Atom(aAStack_b8);
                    uVar10 = (ulong)uVar12;
                    uVar12 = uVar12 + 1;
                  } while (uVar10 < (ulong)((long)local_a8.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_a8.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 1));
                }
              }
            }
            else {
              local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              bVar6 = hlp_reference(this,&local_40,&local_ae);
              if (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_40.
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (((byte)local_ac & bVar6) == 1) {
                r_code::Atom::VLPointer(uVar11,local_ae);
                pAVar9 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(this->current_object + 8),
                                    (ulong)(uVar5 & 0xffff));
                r_code::Atom::operator=(pAVar9,aAStack_b8);
                r_code::Atom::~Atom(aAStack_b8);
                bVar6 = true;
              }
            }
          }
        }
        if ((ushort *)
            local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start == (ushort *)0x0) {
          return bVar6;
        }
        operator_delete(local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        return bVar6;
      }
      if ((char)local_ac == '\0') {
        return true;
      }
      r_code::Atom::RPointer((ushort)&local_a8);
      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar5 & 0xffff)
                         );
      r_code::Atom::operator=(pAVar9,(Atom *)&local_a8);
    }
  }
  r_code::Atom::~Atom((Atom *)&local_a8);
  return true;
}

Assistant:

bool Compiler::read_reference(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write, const ReturnType t)
{
    uint16_t index;

    if ((t == ANY || (t != ANY && current_class.type == t)) && node->cmd == "this") {
        if (write) {
            current_object->code[write_index] = Atom::This();
        }

        return true;
    }

    if (local_reference(node, index, t)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);    // local references are always pointing to the value array
        }

        return true;
    }

    if (global_reference(node, index, t)) { // index is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::RPointer(index);
        }

        return true;
    }

    std::vector<int16_t> v;

    if (this_indirection(node, v, t)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size() + 1);
            current_object->code[extent_index++] = Atom::This();

            for (int16_t type : v) {
                switch (type) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(type);
                    break;
                }
            }
        }

        return true;
    }

    uint32_t cast_opcode;

    if (local_indirection(node, v, t, cast_opcode)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::VLPointer(v[0], cast_opcode);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (global_indirection(node, v, t)) { // v[0] is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::RPointer(v[0]);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (hlp_reference(node, index)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);
        }

        return true;
    }

    return false;
}